

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O2

void __thiscall nnad::Matrix<double>::Transpose(Matrix<double> *this)

{
  uint uVar1;
  uint uVar2;
  pointer pdVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  undefined8 *puVar8;
  ulong uVar9;
  ulong uVar10;
  vector<double,_std::allocator<double>_> new_Matrix;
  allocator_type local_41;
  _Vector_base<double,_std::allocator<double>_> local_40;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_40,
             (long)this->_Lines * (long)this->_Columns,&local_41);
  uVar1 = this->_Lines;
  uVar2 = this->_Columns;
  lVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar2) {
    uVar5 = (ulong)uVar2;
  }
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  lVar7 = 0;
  for (uVar10 = 0; uVar10 != uVar6; uVar10 = uVar10 + 1) {
    pdVar3 = (this->_Matrix).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar8 = (undefined8 *)((long)local_40._M_impl.super__Vector_impl_data._M_start + lVar4);
    for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
      *puVar8 = *(undefined8 *)((long)pdVar3 + uVar9 * 8 + lVar7);
      puVar8 = puVar8 + (int)uVar1;
    }
    lVar7 = lVar7 + (long)(int)uVar2 * 8;
    lVar4 = lVar4 + 8;
  }
  this->_Lines = uVar2;
  this->_Columns = uVar1;
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->_Matrix,(vector<double,_std::allocator<double>_> *)&local_40);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_40);
  return;
}

Assistant:

void Transpose()
    {
      std::vector<T> new_Matrix(_Columns * _Lines);
      for (int i = 0; i < _Lines; i++)
        for (int j = 0; j < _Columns; j++)
          new_Matrix[j*_Lines + i] = _Matrix[i * _Columns + j];

      const int temp = _Lines;
      _Lines   = _Columns;
      _Columns = temp;
      _Matrix  = new_Matrix;
    }